

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::GetUnderlyingType
          (ValidationState_t *_,Decoration *decoration,Instruction *inst,uint32_t *underlying_type)

{
  ushort uVar1;
  bool bVar2;
  int32_t iVar3;
  uint32_t uVar4;
  Instruction *inst_00;
  Instruction *inst_01;
  long lVar5;
  Instruction *inst_02;
  char *pcVar6;
  StorageClass storage_class;
  string local_218;
  StorageClass local_1f4;
  DiagnosticStream local_1f0;
  
  uVar1 = (inst->inst_).opcode;
  if ((int)decoration == -1) {
    if (uVar1 == OpTypeStruct) {
      ValidationState_t::diag(&local_1f0,_,SPV_ERROR_INVALID_DATA,inst);
      (anonymous_namespace)::GetIdDesc_abi_cxx11_(&local_218,(_anonymous_namespace_ *)inst,inst_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f0,local_218._M_dataplus._M_p,local_218._M_string_length);
      pcVar6 = " did not find an member index to get underlying data type for struct type.";
      lVar5 = 0x4a;
    }
    else {
      iVar3 = spvOpcodeIsConstant((uint)uVar1);
      if (iVar3 != 0) {
        uVar4 = (inst->inst_).type_id;
        goto LAB_005f6bcd;
      }
      bVar2 = ValidationState_t::GetPointerTypeInfo
                        (_,(inst->inst_).type_id,underlying_type,&local_1f4);
      if (bVar2) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_1f0,_,SPV_ERROR_INVALID_DATA,inst);
      (anonymous_namespace)::GetIdDesc_abi_cxx11_(&local_218,(_anonymous_namespace_ *)inst,inst_02);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f0,local_218._M_dataplus._M_p,local_218._M_string_length);
      pcVar6 = 
      " is decorated with BuiltIn. BuiltIn decoration should only be applied to struct types, variables and constants."
      ;
      lVar5 = 0x6f;
    }
  }
  else {
    if (uVar1 == 0x1e) {
      uVar4 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[(long)(int)decoration + 2];
LAB_005f6bcd:
      *underlying_type = uVar4;
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_1f0,_,SPV_ERROR_INVALID_DATA,inst);
    (anonymous_namespace)::GetIdDesc_abi_cxx11_(&local_218,(_anonymous_namespace_ *)inst,inst_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,local_218._M_dataplus._M_p,local_218._M_string_length);
    pcVar6 = "Attempted to get underlying data type via member index for non-struct type.";
    lVar5 = 0x4b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,pcVar6,lVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  DiagnosticStream::~DiagnosticStream(&local_1f0);
  return local_1f0.error_;
}

Assistant:

spv_result_t GetUnderlyingType(ValidationState_t& _,
                               const Decoration& decoration,
                               const Instruction& inst,
                               uint32_t* underlying_type) {
  if (decoration.struct_member_index() != Decoration::kInvalidMember) {
    if (inst.opcode() != spv::Op::OpTypeStruct) {
      return _.diag(SPV_ERROR_INVALID_DATA, &inst)
             << GetIdDesc(inst)
             << "Attempted to get underlying data type via member index for "
                "non-struct type.";
    }
    *underlying_type = inst.word(decoration.struct_member_index() + 2);
    return SPV_SUCCESS;
  }

  if (inst.opcode() == spv::Op::OpTypeStruct) {
    return _.diag(SPV_ERROR_INVALID_DATA, &inst)
           << GetIdDesc(inst)
           << " did not find an member index to get underlying data type for "
              "struct type.";
  }

  if (spvOpcodeIsConstant(inst.opcode())) {
    *underlying_type = inst.type_id();
    return SPV_SUCCESS;
  }

  spv::StorageClass storage_class;
  if (!_.GetPointerTypeInfo(inst.type_id(), underlying_type, &storage_class)) {
    return _.diag(SPV_ERROR_INVALID_DATA, &inst)
           << GetIdDesc(inst)
           << " is decorated with BuiltIn. BuiltIn decoration should only be "
              "applied to struct types, variables and constants.";
  }
  return SPV_SUCCESS;
}